

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_get_file_attributes.c
# Opt level: O0

int zip_source_get_file_attributes(zip_source_t *src,zip_file_attributes_t *attributes)

{
  int iVar1;
  zip_int64_t zVar2;
  undefined1 local_38 [8];
  zip_file_attributes_t lower_attributes;
  zip_file_attributes_t *attributes_local;
  zip_source_t *src_local;
  
  if ((src->source_closed & 1U) == 0) {
    lower_attributes._16_8_ = attributes;
    if (attributes == (zip_file_attributes_t *)0x0) {
      zip_error_set(&src->error,0x12,0);
      src_local._4_4_ = -1;
    }
    else {
      zip_file_attributes_init(attributes);
      if (((src->supports & 0x80000U) == 0) ||
         (zVar2 = _zip_source_call(src,(void *)lower_attributes._16_8_,0x18,
                                   ZIP_SOURCE_GET_FILE_ATTRIBUTES), -1 < zVar2)) {
        if (src->src != (zip_source_t *)0x0) {
          iVar1 = zip_source_get_file_attributes(src->src,(zip_file_attributes_t *)local_38);
          if (iVar1 < 0) {
            _zip_error_set_from_source(&src->error,src->src);
            return -1;
          }
          if ((((ulong)local_38 & 1) != 0) && ((*(ulong *)lower_attributes._16_8_ & 1) == 0)) {
            *(undefined1 *)(lower_attributes._16_8_ + 9) = lower_attributes.valid._1_1_;
            *(ulong *)lower_attributes._16_8_ = *(ulong *)lower_attributes._16_8_ | 1;
          }
          if ((((ulong)local_38 & 2) != 0) && ((*(ulong *)lower_attributes._16_8_ & 2) == 0)) {
            *(undefined1 *)(lower_attributes._16_8_ + 10) = lower_attributes.valid._2_1_;
            *(ulong *)lower_attributes._16_8_ = *(ulong *)lower_attributes._16_8_ | 2;
          }
          if (((ulong)local_38 & 4) != 0) {
            if ((*(ulong *)lower_attributes._16_8_ & 4) == 0) {
              *(byte *)(lower_attributes._16_8_ + 0xb) = lower_attributes.valid._3_1_;
              *(ulong *)lower_attributes._16_8_ = *(ulong *)lower_attributes._16_8_ | 4;
            }
            else {
              if (lower_attributes.valid._3_1_ <= *(byte *)(lower_attributes._16_8_ + 0xb)) {
                lower_attributes.valid._3_1_ = *(byte *)(lower_attributes._16_8_ + 0xb);
              }
              *(byte *)(lower_attributes._16_8_ + 0xb) = lower_attributes.valid._3_1_;
            }
          }
          if ((((ulong)local_38 & 8) != 0) && ((*(ulong *)lower_attributes._16_8_ & 8) == 0)) {
            *(undefined4 *)(lower_attributes._16_8_ + 0xc) = lower_attributes.valid._4_4_;
            *(ulong *)lower_attributes._16_8_ = *(ulong *)lower_attributes._16_8_ | 8;
          }
          if (((ulong)local_38 & 0x10) != 0) {
            if ((*(ulong *)lower_attributes._16_8_ & 0x10) == 0) {
              *(ulong *)lower_attributes._16_8_ = *(ulong *)lower_attributes._16_8_ | 0x10;
              *(undefined2 *)(lower_attributes._16_8_ + 0x10) = lower_attributes._8_2_;
              *(undefined2 *)(lower_attributes._16_8_ + 0x12) = lower_attributes._10_2_;
            }
            else {
              *(ushort *)(lower_attributes._16_8_ + 0x10) =
                   *(ushort *)(lower_attributes._16_8_ + 0x10) & (lower_attributes._10_2_ ^ 0xffff);
              *(ushort *)(lower_attributes._16_8_ + 0x10) =
                   *(ushort *)(lower_attributes._16_8_ + 0x10) |
                   lower_attributes._8_2_ & lower_attributes._10_2_;
              *(ushort *)(lower_attributes._16_8_ + 0x12) =
                   *(ushort *)(lower_attributes._16_8_ + 0x12) | lower_attributes._10_2_;
            }
          }
        }
        src_local._4_4_ = 0;
      }
      else {
        src_local._4_4_ = -1;
      }
    }
  }
  else {
    src_local._4_4_ = -1;
  }
  return src_local._4_4_;
}

Assistant:

int
zip_source_get_file_attributes(zip_source_t *src, zip_file_attributes_t *attributes) {
    if (src->source_closed) {
	return -1;
    }
    if (attributes == NULL) {
	zip_error_set(&src->error, ZIP_ER_INVAL, 0);
	return -1;
    }

    zip_file_attributes_init(attributes);

    if (src->supports & ZIP_SOURCE_MAKE_COMMAND_BITMASK(ZIP_SOURCE_GET_FILE_ATTRIBUTES)) {
	if (_zip_source_call(src, attributes, sizeof(*attributes), ZIP_SOURCE_GET_FILE_ATTRIBUTES) < 0) {
	    return -1;
	}
    }

    if (ZIP_SOURCE_IS_LAYERED(src)) {
	zip_file_attributes_t lower_attributes;

	if (zip_source_get_file_attributes(src->src, &lower_attributes) < 0) {
	    _zip_error_set_from_source(&src->error, src->src);
	    return -1;
	}

	if ((lower_attributes.valid & ZIP_FILE_ATTRIBUTES_HOST_SYSTEM) && (attributes->valid & ZIP_FILE_ATTRIBUTES_HOST_SYSTEM) == 0) {
	    attributes->host_system = lower_attributes.host_system;
	    attributes->valid |= ZIP_FILE_ATTRIBUTES_HOST_SYSTEM;
	}
	if ((lower_attributes.valid & ZIP_FILE_ATTRIBUTES_ASCII) && (attributes->valid & ZIP_FILE_ATTRIBUTES_ASCII) == 0) {
	    attributes->ascii = lower_attributes.ascii;
	    attributes->valid |= ZIP_FILE_ATTRIBUTES_ASCII;
	}
	if ((lower_attributes.valid & ZIP_FILE_ATTRIBUTES_VERSION_NEEDED)) {
	    if (attributes->valid & ZIP_FILE_ATTRIBUTES_VERSION_NEEDED) {
		attributes->version_needed = ZIP_MAX(lower_attributes.version_needed, attributes->version_needed);
	    }
	    else {
		attributes->version_needed = lower_attributes.version_needed;
		attributes->valid |= ZIP_FILE_ATTRIBUTES_VERSION_NEEDED;
	    }
	}
	if ((lower_attributes.valid & ZIP_FILE_ATTRIBUTES_EXTERNAL_FILE_ATTRIBUTES) && (attributes->valid & ZIP_FILE_ATTRIBUTES_EXTERNAL_FILE_ATTRIBUTES) == 0) {
	    attributes->external_file_attributes = lower_attributes.external_file_attributes;
	    attributes->valid |= ZIP_FILE_ATTRIBUTES_EXTERNAL_FILE_ATTRIBUTES;
	}
	if ((lower_attributes.valid & ZIP_FILE_ATTRIBUTES_GENERAL_PURPOSE_BIT_FLAGS)) {
	    if (attributes->valid & ZIP_FILE_ATTRIBUTES_GENERAL_PURPOSE_BIT_FLAGS) {
		attributes->general_purpose_bit_flags &= ~lower_attributes.general_purpose_bit_mask;
		attributes->general_purpose_bit_flags |= lower_attributes.general_purpose_bit_flags & lower_attributes.general_purpose_bit_mask;
		attributes->general_purpose_bit_mask |= lower_attributes.general_purpose_bit_mask;
	    }
	    else {
		attributes->valid |= ZIP_FILE_ATTRIBUTES_GENERAL_PURPOSE_BIT_FLAGS;
		attributes->general_purpose_bit_flags = lower_attributes.general_purpose_bit_flags;
		attributes->general_purpose_bit_mask = lower_attributes.general_purpose_bit_mask;
	    }
	}
    }

    return 0;
}